

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

QImage * __thiscall
QRasterBuffer::colorizeBitmap
          (QImage *__return_storage_ptr__,QRasterBuffer *this,QImage *image,QColor *color)

{
  QImageData *pQVar1;
  bool bVar2;
  QRgb QVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int i;
  long in_FS_OFFSET;
  QSize local_80;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::convertToFormat_helper((QImage *)local_58,image,Format_MonoLSB,(ImageConversionFlags)0x0);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = QImage::size((QImage *)local_58);
  QImage::QImage((QImage *)local_78,&local_80,Format_ARGB32_Premultiplied);
  bVar2 = QImage::isNull((QImage *)local_58);
  if (!bVar2) {
    bVar2 = QImage::isNull((QImage *)local_78);
    if (!bVar2) {
      QVar3 = QColor::rgba(color);
      iVar4 = QImage::height((QImage *)local_58);
      uVar5 = QImage::width((QImage *)local_58);
      if (0 < iVar4) {
        uVar10 = (QVar3 & 0xff00ff) * (QVar3 >> 0x18);
        uVar8 = (QVar3 >> 8 & 0xff) * (QVar3 >> 0x18);
        i = 0;
        do {
          puVar6 = QImage::constScanLine((QImage *)local_58,i);
          puVar7 = QImage::scanLine((QImage *)local_78,i);
          if (0 < (int)uVar5) {
            uVar9 = 0;
            do {
              uVar11 = QVar3 & 0xff000000 | (uVar8 >> 8) + uVar8 + 0x80 & 0xff00 |
                       uVar10 + (uVar10 >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff;
              if ((puVar6[uVar9 >> 3 & 0x1fffffff] >> ((uint)uVar9 & 7) & 1) == 0) {
                uVar11 = 0;
              }
              *(uint *)(puVar7 + uVar9 * 4) = uVar11;
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
          i = i + 1;
        } while (i != iVar4);
      }
      QPaintDevice::QPaintDevice(&__return_storage_ptr__->super_QPaintDevice);
      pQVar1 = local_68;
      (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
           (_func_int **)&PTR__QImage_007e2f38;
      local_68 = (QImageData *)0x0;
      __return_storage_ptr__->d = pQVar1;
      goto LAB_003c3773;
    }
  }
  QImage::QImage(__return_storage_ptr__,image);
LAB_003c3773:
  QImage::~QImage((QImage *)local_78);
  QImage::~QImage((QImage *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QImage QRasterBuffer::colorizeBitmap(const QImage &image, const QColor &color)
{
    Q_ASSERT(image.depth() == 1);

    const QImage sourceImage = image.convertToFormat(QImage::Format_MonoLSB);
    QImage dest = QImage(sourceImage.size(), QImage::Format_ARGB32_Premultiplied);
    if (sourceImage.isNull() || dest.isNull())
        return image; // we must have run out of memory

    QRgb fg = qPremultiply(color.rgba());
    QRgb bg = 0;

    int height = sourceImage.height();
    int width = sourceImage.width();
    for (int y=0; y<height; ++y) {
        const uchar *source = sourceImage.constScanLine(y);
        QRgb *target = reinterpret_cast<QRgb *>(dest.scanLine(y));
        for (int x=0; x < width; ++x)
            target[x] = (source[x>>3] >> (x&7)) & 1 ? fg : bg;
    }
    return dest;
}